

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool ON_Font::IsValidFaceName(wchar_t *face_name)

{
  wchar_t wVar1;
  ulong uVar2;
  
  if ((face_name == (wchar_t *)0x0) || ((*face_name & 0xffffffdfU) == 0)) {
    return false;
  }
  uVar2 = 0;
  do {
    wVar1 = face_name[uVar2];
    if (wVar1 == L'\0') goto LAB_0048555c;
    if (wVar1 < L' ') {
      return false;
    }
    if (((uint)(wVar1 + L'\xffffffde') < 0x3f) &&
       ((0x400000000a000023U >> ((ulong)(uint)(wVar1 + L'\xffffffde') & 0x3f) & 1) != 0)) {
      return false;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x20);
  uVar2 = 0x20;
LAB_0048555c:
  return face_name[uVar2 & 0xffffffff] == L'\0';
}

Assistant:

bool ON_Font::IsValidFaceName(
  const wchar_t* face_name
  )
{
  if ( nullptr == face_name || 0 == face_name[0] || ON_wString::Space == face_name[0])
    return false;
  
  int i = 0;
  while (i < 32 && 0 != face_name[i])
  {
    if (face_name[i] < ON_wString::Space )
      return false;
    switch (face_name[i])
    {
    case ';':
    case '"':
    case '\'':
    case '`':
    case '=':
    case '#':
      // lots more
      return false;
    //case '@': - There are valid fonts like @Gulim with '@' in the name.
    // case '.' - Many apple font names begin with a period
    // case '-' - A hyphen is common in PostScript names
    // case ' ' - A space is common in many names
    default:
      break;
    }
    
    i++;
  }

  if (0 != face_name[i])
    return false;

  return true;
}